

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling_p.h
# Opt level: O3

QRect QHighDpi::toNativePixels<QRect,QScreen>(QRect *value,QScreen *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  undefined8 uVar5;
  int iVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  double dVar8;
  QRect QVar9;
  
  uVar5 = QHighDpiScaling::scaleAndOrigin(context,(Point)ZEXT812(0));
  uVar1 = value->x1;
  uVar2 = value->y1;
  dVar7 = (double)(uVar1 - (int)uVar5) * extraout_XMM0_Qa;
  dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
  bVar3 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  QVar9.x1.m_i = (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar7) +
                 (int)uVar5;
  iVar6 = (int)((ulong)uVar5 >> 0x20);
  dVar7 = (double)(uVar2 - iVar6) * extraout_XMM0_Qa;
  dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
  bVar3 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  iVar6 = (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar7) + iVar6;
  dVar8 = (double)(((value->x2).m_i - uVar1) + 1) * extraout_XMM0_Qa;
  dVar7 = (double)(((value->y2).m_i - uVar2) + 1) * extraout_XMM0_Qa;
  dVar7 = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
  bVar3 = 2147483647.0 < dVar7;
  if (dVar7 <= -2147483648.0) {
    dVar7 = -2147483648.0;
  }
  dVar8 = (double)((ulong)dVar8 & 0x8000000000000000 | 0x3fe0000000000000) + dVar8;
  bVar4 = 2147483647.0 < dVar8;
  if (dVar8 <= -2147483648.0) {
    dVar8 = -2147483648.0;
  }
  QVar9.x2.m_i = (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar8) +
                 QVar9.x1.m_i + -1;
  QVar9.y1.m_i = iVar6;
  QVar9.y2.m_i = (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar7) +
                 iVar6 + -1;
  return QVar9;
}

Assistant:

T toNativePixels(const T &value, const C *context)
{
    QHighDpiScaling::ScaleAndOrigin so = QHighDpiScaling::scaleAndOrigin(context);
    return scale(value, so.factor, so.origin);
}